

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * CLI::clean_name_string(string *name,string *keyChars)

{
  char *pcVar1;
  pointer __s;
  size_type sVar2;
  void *pvVar3;
  char __c;
  
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(name,(keyChars->_M_dataplus)._M_p,0,keyChars->_M_string_length);
  if ((sVar2 == 0xffffffffffffffff) &&
     (((pcVar1 = (name->_M_dataplus)._M_p, *pcVar1 != '[' ||
       (pcVar1[name->_M_string_length - 1] != ']')) &&
      (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(name,"\'`\"\\",0,4), sVar2 == 0xffffffffffffffff)))) {
    return name;
  }
  __c = '\'';
  if ((name->_M_string_length != 0) &&
     (__s = (name->_M_dataplus)._M_p, pvVar3 = memchr(__s,0x27,name->_M_string_length),
     (long)pvVar3 - (long)__s != -1 && pvVar3 != (void *)0x0)) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(name,detail::escapedChars_abi_cxx11_,0,DAT_004f5360);
    __c = '\"';
    if (sVar2 != 0xffffffffffffffff) {
      clean_name_string((CLI *)name);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (name,0,1,__c);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (name,__c);
  return name;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}